

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O3

void __thiscall
S2ShapeIndexRegion<MutableS2ShapeIndex>::S2ShapeIndexRegion
          (S2ShapeIndexRegion<MutableS2ShapeIndex> *this,MutableS2ShapeIndex *index)

{
  int iVar1;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *pbVar2;
  __pointer_type pSVar3;
  long lVar4;
  const_iterator cVar5;
  
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2ShapeIndexRegion_002bcc68;
  (this->contains_query_).index_ = index;
  (this->contains_query_).options_.vertex_model_ = SEMI_OPEN;
  (this->contains_query_).it_.super_IteratorBase.id_.id_ = 0xffffffffffffffff;
  (this->contains_query_).it_.super_IteratorBase.cell_._M_b._M_p = (__pointer_type)0x0;
  (this->contains_query_).it_.super_IteratorBase._vptr_IteratorBase =
       (_func_int **)&PTR__IteratorBase_002bb190;
  (this->contains_query_).it_.iter_.node =
       (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
        *)0x0;
  (this->contains_query_).it_.iter_.position = -1;
  (this->contains_query_).it_.end_.node =
       (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
        *)0x0;
  (this->contains_query_).it_.end_.position = -1;
  if ((index->index_status_)._M_i != FRESH) {
    MutableS2ShapeIndex::ApplyUpdatesThreadSafe(index);
  }
  (this->contains_query_).it_.index_ = index;
  cVar5 = gtl::internal_btree::
          btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
          ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                 *)&index->cell_map_);
  (this->contains_query_).it_.end_.node = cVar5.node;
  (this->contains_query_).it_.end_.position = cVar5.position;
  (this->contains_query_).it_.iter_.position = (this->contains_query_).it_.end_.position;
  (this->contains_query_).it_.iter_.node = (this->contains_query_).it_.end_.node;
  pbVar2 = (this->contains_query_).it_.iter_.node;
  iVar1 = (this->contains_query_).it_.iter_.position;
  if (iVar1 == cVar5.position && pbVar2 == cVar5.node) {
    (this->contains_query_).it_.super_IteratorBase.id_.id_ = 0xffffffffffffffff;
    pSVar3 = (__pointer_type)0x0;
  }
  else {
    if (((ulong)pbVar2 & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                    ,0x1e1,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                   );
    }
    lVar4 = (long)iVar1 * 0x10;
    pSVar3 = *(__pointer_type *)(pbVar2 + lVar4 + 0x18);
    (this->contains_query_).it_.super_IteratorBase.id_.id_ = *(uint64 *)(pbVar2 + lVar4 + 0x10);
  }
  (this->contains_query_).it_.super_IteratorBase.cell_._M_b._M_p = pSVar3;
  this->iter_ = &(this->contains_query_).it_;
  return;
}

Assistant:

S2ShapeIndexRegion<IndexType>::S2ShapeIndexRegion(const IndexType* index)
    : contains_query_(index) {
}